

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.cpp
# Opt level: O0

int __thiscall
NaPNFill::verify(NaPNFill *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NaVector *pNVar5;
  bool local_1d;
  
  uVar1 = NaVector::dim(&this->vFill);
  pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
  uVar2 = (*pNVar5->_vptr_NaVector[6])();
  if (uVar1 != uVar2) {
    uVar1 = NaVector::dim(&this->vFill);
    pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
    uVar2 = (*pNVar5->_vptr_NaVector[6])();
    NaPrintLog("%s.%s: fill vector has mismatched dimension: %u!=%u\n",(ulong)uVar1,(ulong)uVar2);
  }
  pNVar5 = NaPetriCnOutput::data(&this->out);
  iVar3 = (*pNVar5->_vptr_NaVector[6])();
  pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
  iVar4 = (*pNVar5->_vptr_NaVector[6])();
  local_1d = false;
  if (iVar3 == iVar4) {
    uVar1 = NaVector::dim(&this->vFill);
    pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
    uVar2 = (*pNVar5->_vptr_NaVector[6])();
    local_1d = false;
    if (uVar1 == uVar2) {
      pNVar5 = NaPetriCnOutput::data(&this->sync);
      iVar3 = (*pNVar5->_vptr_NaVector[6])();
      local_1d = iVar3 == 1;
    }
  }
  return (uint)local_1d;
}

Assistant:

bool
NaPNFill::verify ()
{
  if(vFill.dim() != in.data().dim()){
    NaPrintLog("%s.%s: fill vector has mismatched dimension: %u!=%u\n",
	       vFill.dim(), in.data().dim());
  }

  return out.data().dim() == in.data().dim()
    && vFill.dim() == in.data().dim()
    && 1 == sync.data().dim();
}